

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O0

void Tests::AddInstructionEvaluionFail(char *reason)

{
  int iVar1;
  char *pcVar2;
  uint local_14;
  uint i;
  char *reason_local;
  
  local_14 = 0;
  while( true ) {
    if (instructionEvaluionFails <= local_14) {
      if (instructionEvaluionFails < 0x80) {
        if (instructionEvaluionFails < 0x80) {
          pcVar2 = strdup(reason);
          *(char **)(instructionEvaluionFailInfo + (ulong)instructionEvaluionFails * 0x10) = pcVar2;
          *(undefined4 *)(instructionEvaluionFailInfo + (ulong)instructionEvaluionFails * 0x10 + 8)
               = 1;
          instructionEvaluionFails = instructionEvaluionFails + 1;
        }
        return;
      }
      __assert_fail("instructionEvaluionFails < 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                    ,0xec,"void Tests::AddInstructionEvaluionFail(const char *)");
    }
    iVar1 = strcmp(*(char **)(instructionEvaluionFailInfo + (ulong)local_14 * 0x10),reason);
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  *(int *)(instructionEvaluionFailInfo + (ulong)local_14 * 0x10 + 8) =
       *(int *)(instructionEvaluionFailInfo + (ulong)local_14 * 0x10 + 8) + 1;
  return;
}

Assistant:

void AddInstructionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < instructionEvaluionFails; i++)
		{
			if(strcmp(instructionEvaluionFailInfo[i].reason, reason) == 0)
			{
				instructionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(instructionEvaluionFails < 128);

		if(instructionEvaluionFails < 128)
		{
			instructionEvaluionFailInfo[instructionEvaluionFails].reason = strdup(reason);
			instructionEvaluionFailInfo[instructionEvaluionFails].count = 1;
			instructionEvaluionFails++;
		}
	}